

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O3

session_base_t *
zmq::session_base_t::create
          (io_thread_t *io_thread_,bool active_,socket_base_t *socket_,options_t *options_,
          address_t *addr_)

{
  hello_msg_session_t *this;
  session_base_t *this_00;
  dish_session_t *this_01;
  int *piVar1;
  req_session_t *this_02;
  radio_session_t *this_03;
  
  switch(options_->type) {
  case '\0':
  case '\x01':
  case '\x02':
  case '\x04':
  case '\x05':
  case '\x06':
  case '\a':
  case '\b':
  case '\t':
  case '\n':
  case '\v':
  case '\f':
  case '\r':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x14':
    if ((options_->can_send_hello_msg == true) &&
       ((options_->hello_msg).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (options_->hello_msg).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start)) {
      this = (hello_msg_session_t *)operator_new(0x600,(nothrow_t *)&std::nothrow);
      if (this != (hello_msg_session_t *)0x0) {
        hello_msg_session_t::hello_msg_session_t(this,io_thread_,active_,socket_,options_,addr_);
        return &this->super_session_base_t;
      }
    }
    else {
      this_00 = (session_base_t *)operator_new(0x5f8,(nothrow_t *)&std::nothrow);
      if (this_00 != (session_base_t *)0x0) {
        session_base_t(this_00,io_thread_,active_,socket_,options_,addr_);
        return this_00;
      }
    }
    break;
  case '\x03':
    this_02 = (req_session_t *)operator_new(0x600,(nothrow_t *)&std::nothrow);
    if (this_02 != (req_session_t *)0x0) {
      req_session_t::req_session_t(this_02,io_thread_,active_,socket_,options_,addr_);
      return &this_02->super_session_base_t;
    }
    break;
  case '\x0e':
    this_03 = (radio_session_t *)operator_new(0x640,(nothrow_t *)&std::nothrow);
    if (this_03 != (radio_session_t *)0x0) {
      radio_session_t::radio_session_t(this_03,io_thread_,active_,socket_,options_,addr_);
      return &this_03->super_session_base_t;
    }
    break;
  case '\x0f':
    this_01 = (dish_session_t *)operator_new(0x640,(nothrow_t *)&std::nothrow);
    if (this_01 != (dish_session_t *)0x0) {
      dish_session_t::dish_session_t(this_01,io_thread_,active_,socket_,options_,addr_);
      return &this_01->super_session_base_t;
    }
    break;
  default:
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    return (session_base_t *)0x0;
  }
  create();
  return (session_base_t *)0x0;
}

Assistant:

zmq::session_base_t *zmq::session_base_t::create (class io_thread_t *io_thread_,
                                                  bool active_,
                                                  class socket_base_t *socket_,
                                                  const options_t &options_,
                                                  address_t *addr_)
{
    session_base_t *s = NULL;
    switch (options_.type) {
        case ZMQ_REQ:
            s = new (std::nothrow)
              req_session_t (io_thread_, active_, socket_, options_, addr_);
            break;
        case ZMQ_RADIO:
            s = new (std::nothrow)
              radio_session_t (io_thread_, active_, socket_, options_, addr_);
            break;
        case ZMQ_DISH:
            s = new (std::nothrow)
              dish_session_t (io_thread_, active_, socket_, options_, addr_);
            break;
        case ZMQ_DEALER:
        case ZMQ_REP:
        case ZMQ_ROUTER:
        case ZMQ_PUB:
        case ZMQ_XPUB:
        case ZMQ_SUB:
        case ZMQ_XSUB:
        case ZMQ_PUSH:
        case ZMQ_PULL:
        case ZMQ_PAIR:
        case ZMQ_STREAM:
        case ZMQ_SERVER:
        case ZMQ_CLIENT:
        case ZMQ_GATHER:
        case ZMQ_SCATTER:
        case ZMQ_DGRAM:
        case ZMQ_PEER:
        case ZMQ_CHANNEL:
#ifdef ZMQ_BUILD_DRAFT_API
            if (options_.can_send_hello_msg && options_.hello_msg.size () > 0)
                s = new (std::nothrow) hello_msg_session_t (
                  io_thread_, active_, socket_, options_, addr_);
            else
                s = new (std::nothrow) session_base_t (
                  io_thread_, active_, socket_, options_, addr_);

            break;
#else
            s = new (std::nothrow)
              session_base_t (io_thread_, active_, socket_, options_, addr_);
            break;
#endif

        default:
            errno = EINVAL;
            return NULL;
    }
    alloc_assert (s);
    return s;
}